

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_mixer.c
# Opt level: O0

_Bool al_set_mixer_quality(ALLEGRO_MIXER *mixer,ALLEGRO_MIXER_QUALITY new_quality)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  _Bool ret;
  char *in_stack_ffffffffffffffe8;
  undefined1 local_d;
  
  maybe_lock_mutex((ALLEGRO_MUTEX *)0x10c27e);
  if (*(int *)(in_RDI + 0x110) == in_ESI) {
    local_d = true;
  }
  else {
    lVar1 = _al_vector_size(in_RDI + 0x128);
    if (lVar1 != 0) {
      _al_set_error(in_ESI,in_stack_ffffffffffffffe8);
    }
    else {
      *(int *)(in_RDI + 0x110) = in_ESI;
    }
    local_d = lVar1 == 0;
  }
  maybe_unlock_mutex((ALLEGRO_MUTEX *)0x10c2ec);
  return local_d;
}

Assistant:

bool al_set_mixer_quality(ALLEGRO_MIXER *mixer, ALLEGRO_MIXER_QUALITY new_quality)
{
   bool ret;
   ASSERT(mixer);

   maybe_lock_mutex(mixer->ss.mutex);

   if (mixer->quality == new_quality) {
      ret = true;
   }
   else if (_al_vector_size(&mixer->streams) == 0) {
      mixer->quality = new_quality;
      ret = true;
   }
   else {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Attempted to change the quality of a mixer with attachments");
      ret = false;
   }

   maybe_unlock_mutex(mixer->ss.mutex);

   return ret;
}